

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O2

void __thiscall slang::parsing::ParserBase::prependSkippedTokens(ParserBase *this,Token *token)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *in_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  EVP_PKEY_CTX *src;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  BumpAllocator *alloc;
  Token TVar2;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  Trivia local_c0;
  SmallVector<slang::parsing::Trivia,_8UL> buffer;
  
  buffer.super_SmallVectorBase<slang::parsing::Trivia>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::parsing::Trivia>.firstElement;
  buffer.super_SmallVectorBase<slang::parsing::Trivia>.len = 0;
  buffer.super_SmallVectorBase<slang::parsing::Trivia>.cap = 8;
  iVar1 = SmallVectorBase<slang::parsing::Token>::copy
                    (&(this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>,
                     (EVP_PKEY_CTX *)this->alloc,in_RDX);
  tokens._M_ptr._4_4_ = extraout_var;
  tokens._M_ptr._0_4_ = iVar1;
  tokens._M_extent._M_extent_value = extraout_RDX._M_extent_value;
  Trivia::Trivia(&local_c0,SkippedTokens,tokens);
  SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
            (&buffer.super_SmallVectorBase<slang::parsing::Trivia>,&local_c0);
  local_c0 = (Trivia)Token::trivia(token);
  SmallVectorBase<slang::parsing::Trivia>::
  append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
            (&buffer.super_SmallVectorBase<slang::parsing::Trivia>,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&local_c0);
  alloc = this->alloc;
  iVar1 = SmallVectorBase<slang::parsing::Trivia>::copy
                    (&buffer.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc,src
                    );
  trivia._M_ptr._4_4_ = extraout_var_00;
  trivia._M_ptr._0_4_ = iVar1;
  trivia._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
  TVar2 = Token::withTrivia(token,alloc,trivia);
  *token = TVar2;
  (this->skippedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  SmallVectorBase<slang::parsing::Trivia>::cleanup
            (&buffer.super_SmallVectorBase<slang::parsing::Trivia>,(EVP_PKEY_CTX *)alloc);
  return;
}

Assistant:

void ParserBase::prependSkippedTokens(Token& token) {
    SmallVector<Trivia, 8> buffer;
    buffer.push_back(Trivia{TriviaKind::SkippedTokens, skippedTokens.copy(alloc)});
    buffer.append_range(token.trivia());

    token = token.withTrivia(alloc, buffer.copy(alloc));
    skippedTokens.clear();
}